

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
* pstore::index::details::linear_node::get_node
            (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
             *__return_storage_ptr__,database *db,index_pointer node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint64_t uVar2;
  linear_node *elements;
  element_type *local_40;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_38;
  
  elements = node.linear_ & 0xfffffffffffffffc;
  if (((ulong)node.internal_ & 2) == 0) {
    database::getro<pstore::index::details::linear_node,void>
              ((database *)&stack0xffffffffffffffc0,
               (typed_address<pstore::index::details::linear_node>)db,(size_t)elements);
    uVar2 = local_40->size_;
    if (local_38._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl);
    }
    (*db->_vptr_database[2])(&stack0xffffffffffffffc0,db,elements,uVar2 * 8 + 0x10,1,0);
    if ((_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)local_38._M_head_impl !=
        (_Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_38._M_head_impl)->_M_elems[0].value.
                  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(local_38._M_head_impl)->_M_elems[0].value.
                  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl);
    }
    if (*(long *)(local_40->signature_)._M_elems != 0x72656e4c78646e49) {
      raise<pstore::error_code>(index_corrupt);
    }
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_40;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      __return_storage_ptr__->second = local_40;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_38._M_head_impl)->_M_elems[0].value.
                  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = &(local_38._M_head_impl)->_M_elems[0].value.
                  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
      __return_storage_ptr__->second = local_40;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_head_impl);
      }
    }
  }
  else {
    if (*(long *)(elements->signature_)._M_elems != 0x72656e4c78646e49) {
      assert_failed("ptr->signature_ == node_signature_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                    ,0x7d);
    }
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->second = elements;
  }
  return __return_storage_ptr__;
}

Assistant:

auto linear_node::get_node (database const & db, index_pointer const node)
                -> std::pair<std::shared_ptr<linear_node const>, linear_node const *> {

                if (node.is_heap ()) {
                    auto const * ptr = node.untag<linear_node const *> ();
                    PSTORE_ASSERT (ptr->signature_ == node_signature_);
                    return {nullptr, ptr};
                }

                // Read an existing node. First work out its size.
                auto const addr = node.untag_address<linear_node> ();
                std::size_t const in_store_size =
                    linear_node::size_bytes (db.getro (addr)->size ());

                // Now access the data block for this linear node. We need to use the "raw address"
                // version of getro() because in_store_size is a number of bytes, not a number of
                // instances of linear_node.
                auto const ln = std::static_pointer_cast<linear_node const> (
                    db.getro (addr.to_address (), in_store_size));
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (ln->signature_ != node_signature_) {
                    raise (pstore::error_code::index_corrupt);
                }
#endif
                auto const * const p = ln.get ();
                return {std::move (ln), p};
            }